

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_tile_info_max_tile(AV1_COMMON *cm,aom_write_bit_buffer *wb)

{
  int iVar1;
  int iVar2;
  aom_write_bit_buffer *in_RSI;
  long in_RDI;
  int ones;
  CommonTileParams *tiles;
  int i;
  int size_sb;
  int height_sb;
  int width_sb;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar3;
  int local_2c;
  int local_20;
  int local_18;
  
  local_18 = *(int *)(in_RDI + 0x214) +
             (1 << ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x6088) + 0x24) & 0x1f)) + -1 >>
             ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x6088) + 0x24) & 0x1f);
  aom_wb_write_bit(in_RSI,*(int *)(in_RDI + 0x60b4));
  if (*(int *)(in_RDI + 0x60b4) == 0) {
    for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x60a0); local_20 = local_20 + 1) {
      wb_write_uniform((aom_write_bit_buffer *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    }
    for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x60a4); local_20 = local_20 + 1) {
      iVar1 = *(int *)(in_RDI + 0x61e0 + (long)(local_20 + 1) * 4);
      iVar2 = *(int *)(in_RDI + 0x61e0 + (long)local_20 * 4);
      iVar3 = local_18;
      if (*(int *)(in_RDI + 0x60ac) <= local_18) {
        iVar3 = *(int *)(in_RDI + 0x60ac);
      }
      wb_write_uniform((aom_write_bit_buffer *)CONCAT44(iVar3,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      local_18 = local_18 - (iVar1 - iVar2);
    }
  }
  else {
    local_2c = *(int *)(in_RDI + 0x60b8) - *(int *)(in_RDI + 0x60c8);
    while (local_2c != 0) {
      aom_wb_write_bit(in_RSI,1);
      local_2c = local_2c + -1;
    }
    if (*(int *)(in_RDI + 0x60b8) < *(int *)(in_RDI + 0x60d0)) {
      aom_wb_write_bit(in_RSI,0);
    }
    local_2c = *(int *)(in_RDI + 0x60bc) - *(int *)(in_RDI + 0x60cc);
    while (local_2c != 0) {
      aom_wb_write_bit(in_RSI,1);
      local_2c = local_2c + -1;
    }
    if (*(int *)(in_RDI + 0x60bc) < *(int *)(in_RDI + 0x60d4)) {
      aom_wb_write_bit(in_RSI,0);
    }
  }
  return;
}

Assistant:

static inline void write_tile_info_max_tile(const AV1_COMMON *const cm,
                                            struct aom_write_bit_buffer *wb) {
  int width_sb =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, cm->seq_params->mib_size_log2);
  int height_sb =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_rows, cm->seq_params->mib_size_log2);
  int size_sb, i;
  const CommonTileParams *const tiles = &cm->tiles;

  aom_wb_write_bit(wb, tiles->uniform_spacing);

  if (tiles->uniform_spacing) {
    int ones = tiles->log2_cols - tiles->min_log2_cols;
    while (ones--) {
      aom_wb_write_bit(wb, 1);
    }
    if (tiles->log2_cols < tiles->max_log2_cols) {
      aom_wb_write_bit(wb, 0);
    }

    // rows
    ones = tiles->log2_rows - tiles->min_log2_rows;
    while (ones--) {
      aom_wb_write_bit(wb, 1);
    }
    if (tiles->log2_rows < tiles->max_log2_rows) {
      aom_wb_write_bit(wb, 0);
    }
  } else {
    // Explicit tiles with configurable tile widths and heights
    // columns
    for (i = 0; i < tiles->cols; i++) {
      size_sb = tiles->col_start_sb[i + 1] - tiles->col_start_sb[i];
      wb_write_uniform(wb, AOMMIN(width_sb, tiles->max_width_sb), size_sb - 1);
      width_sb -= size_sb;
    }
    assert(width_sb == 0);

    // rows
    for (i = 0; i < tiles->rows; i++) {
      size_sb = tiles->row_start_sb[i + 1] - tiles->row_start_sb[i];
      wb_write_uniform(wb, AOMMIN(height_sb, tiles->max_height_sb),
                       size_sb - 1);
      height_sb -= size_sb;
    }
    assert(height_sb == 0);
  }
}